

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O2

void ucol_sit_initCollatorSpecs(CollatorSpec *spec)

{
  long lVar1;
  
  memset(spec,0,0x348);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    spec->options[lVar1] = UCOL_DEFAULT;
  }
  return;
}

Assistant:

static
void ucol_sit_initCollatorSpecs(CollatorSpec *spec)
{
    // reset everything
    uprv_memset(spec, 0, sizeof(CollatorSpec));
    // set collation options to default
    int32_t i = 0;
    for(i = 0; i < UCOL_ATTRIBUTE_COUNT; i++) {
        spec->options[i] = UCOL_DEFAULT;
    }
}